

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O1

glsl_type *
array_sizing_visitor::resize_interface_members
          (glsl_type *type,int *max_ifc_array_access,bool is_ssbo)

{
  uint num_fields;
  glsl_type *pgVar1;
  glsl_struct_field *pgVar2;
  ulong uVar3;
  ulong uVar4;
  bool implicit_sized_array;
  bool local_41;
  glsl_struct_field *local_40;
  glsl_type *local_38;
  
  num_fields = type->length;
  uVar3 = (ulong)num_fields;
  local_40 = (glsl_struct_field *)operator_new__(uVar3 * 0x30);
  if (uVar3 != 0) {
    pgVar2 = local_40;
    do {
      pgVar2->type = (glsl_type *)0x0;
      pgVar2->name = (char *)0x0;
      pgVar2->location = -1;
      pgVar2->offset = -1;
      pgVar2->xfb_buffer = 0;
      pgVar2->xfb_stride = 0;
      *(ushort *)&pgVar2->field_0x20 = *(ushort *)&pgVar2->field_0x20 & 0x8000;
      pgVar2->image_format = PIPE_FORMAT_NONE;
      pgVar2->field_0x28 = pgVar2->field_0x28 & 0xfc;
      pgVar2 = pgVar2 + 1;
    } while (pgVar2 != local_40 + uVar3);
  }
  local_38 = type;
  memcpy(local_40,(type->fields).array,uVar3 * 0x30);
  if (uVar3 != 0) {
    uVar4 = 0;
    pgVar2 = local_40;
    do {
      local_41 = (bool)((byte)pgVar2->field_0x28 >> 1 & 1);
      if (num_fields - 1 != uVar4 || !is_ssbo) {
        fixup_type(&pgVar2->type,max_ifc_array_access[uVar4],false,&local_41);
      }
      pgVar2->field_0x28 = pgVar2->field_0x28 & 0xfd | local_41 * '\x02';
      uVar4 = uVar4 + 1;
      pgVar2 = pgVar2 + 1;
    } while (uVar3 != uVar4);
  }
  pgVar2 = local_40;
  pgVar1 = glsl_type::get_interface_instance
                     (local_40,num_fields,
                      *(uint *)&local_38->field_0x4 >> 0x16 & GLSL_INTERFACE_PACKING_STD430,
                      (bool)((byte)(*(uint *)&local_38->field_0x4 >> 0x18) & 1),local_38->name);
  operator_delete__(pgVar2);
  return pgVar1;
}

Assistant:

static const glsl_type *
   resize_interface_members(const glsl_type *type,
                            const int *max_ifc_array_access,
                            bool is_ssbo)
   {
      unsigned num_fields = type->length;
      glsl_struct_field *fields = new glsl_struct_field[num_fields];
      memcpy(fields, type->fields.structure,
             num_fields * sizeof(*fields));
      for (unsigned i = 0; i < num_fields; i++) {
         bool implicit_sized_array = fields[i].implicit_sized_array;
         /* If SSBO last member is unsized array, we don't replace it by a sized
          * array.
          */
         if (is_ssbo && i == (num_fields - 1))
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       true, &implicit_sized_array);
         else
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       false, &implicit_sized_array);
         fields[i].implicit_sized_array = implicit_sized_array;
      }
      glsl_interface_packing packing =
         (glsl_interface_packing) type->interface_packing;
      bool row_major = (bool) type->interface_row_major;
      const glsl_type *new_ifc_type =
         glsl_type::get_interface_instance(fields, num_fields,
                                           packing, row_major, type->name);
      delete [] fields;
      return new_ifc_type;
   }